

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O1

Box * __thiscall libDAI::Box::operator*=(Box *this,Box *c)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  
  pdVar1 = (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pdVar2 = (c->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pdVar1[lVar4] = pdVar2[lVar4] * pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  pdVar1 = (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pdVar2 = (c->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pdVar1[lVar4] = pdVar2[lVar4] * pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return this;
}

Assistant:

Box& operator*= (const Box &c) {
//#ifdef DEBUG
                assert( _min <= _max );
                assert( c._min <= c._max );
//#endif
                assert( _vars == c._vars );
                _min *= c._min;
                _max *= c._max;
                return *this;
            }